

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O2

int __thiscall AliHttpRequest::CommitRequestWithBody(AliHttpRequest *this,string *body)

{
  bool bVar1;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  bVar1 = std::operator==(&this->method_,"POST");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Content-Length",&local_51);
    get_format_string_abi_cxx11_(&local_50,"%d",body->_M_string_length);
    AddRequestHeader(this,&local_30,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  (**this->_vptr_AliHttpRequest)(this);
  if (body->_M_string_length != 0) {
    (*this->connection_->_vptr_AliConnection[1])(this->connection_,(body->_M_dataplus)._M_p);
  }
  return 0;
}

Assistant:

int AliHttpRequest::CommitRequestWithBody(const std::string& body) {
  // todo:check body size
  int ret = 0;

  if(this->method_ == "POST") {
    this->AddRequestHeader("Content-Length", get_format_string("%d", body.size()));
  }
  
  ret = this->CommitRequest();

  if(body.size()) {
    this->connection_->Send((char*)body.c_str(), body.size());
  }
  
  return 0;
}